

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

HttpRanges * __thiscall
kj::tryParseHttpRangeHeader
          (HttpRanges *__return_storage_ptr__,kj *this,ArrayPtr<const_char> value,
          uint64_t contentLength)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  HttpByteRange *pHVar4;
  RemoveConst<kj::HttpByteRange> *pRVar5;
  HttpByteRange *pHVar6;
  kj *pkVar7;
  kj *pkVar8;
  kj *pkVar9;
  kj *newSize;
  kj *pkVar10;
  uint uVar11;
  kj *pkVar12;
  byte bVar13;
  kj *pkVar14;
  kj *unaff_R12;
  kj *unaff_R14;
  kj kVar15;
  Vector<kj::HttpByteRange> satisfiableRanges;
  Vector<kj::HttpByteRange> local_98;
  kj *local_70;
  uint local_64;
  kj *local_60;
  char *local_58;
  kj *local_50;
  Array<kj::HttpByteRange> local_48;
  
  local_60 = (kj *)value.size_;
  local_58 = value.ptr;
  pkVar8 = this + 5;
  do {
    kVar15 = pkVar8[-5];
    if ((byte)kVar15 < 0x20) {
      if (kVar15 != (kj)0x9) goto LAB_00404a53;
    }
    else if (kVar15 != (kj)0x20) break;
    pkVar8 = pkVar8 + 1;
  } while( true );
  if (((((kVar15 == (kj)0x42) || (kVar15 == (kj)0x62)) && (((byte)pkVar8[-4] | 0x20) == 0x79)) &&
      ((((byte)pkVar8[-3] | 0x20) == 0x74 && (((byte)pkVar8[-2] | 0x20) == 0x65)))) &&
     (((byte)pkVar8[-1] | 0x20) == 0x73)) {
    for (; (*pkVar8 == (kj)0x20 || (*pkVar8 == (kj)0x9)); pkVar8 = pkVar8 + 1) {
    }
    bVar1 = true;
  }
  else {
LAB_00404a53:
    bVar1 = false;
    pkVar8 = this;
  }
  if ((!bVar1) || (*pkVar8 != (kj)0x3d)) {
    __return_storage_ptr__->tag = 3;
    return __return_storage_ptr__;
  }
  local_98.builder.ptr = (HttpByteRange *)0x0;
  local_98.builder.pos = (HttpByteRange *)0x0;
  local_98.builder.endPtr = (HttpByteRange *)0x0;
  local_98.builder.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  local_70 = local_60 + -1;
  local_64 = (int)value.size_ - 1;
  local_50 = this;
  bVar1 = false;
  do {
    pkVar9 = pkVar8 + 1;
    for (pkVar7 = pkVar9; (*pkVar7 == (kj)0x9 || (pkVar8 = pkVar7, *pkVar7 == (kj)0x20));
        pkVar7 = pkVar7 + 1) {
    }
    while( true ) {
      kVar15 = *pkVar8;
      newSize = (kj *)(ulong)(byte)kVar15;
      if ((kVar15 != (kj)0x9) && (kVar15 != (kj)0x20)) break;
      pkVar8 = pkVar8 + 1;
    }
    pkVar10 = (kj *)0x0;
    pkVar12 = pkVar8;
    do {
      bVar13 = (char)*pkVar12 - 0x30;
      if (bVar13 < 10) {
        pkVar10 = (kj *)(ulong)(((uint)(byte)*pkVar12 + (int)pkVar10 * 10) - 0x30);
        pkVar12 = pkVar12 + 1;
      }
      else {
        this = (kj *)CONCAT71((int7)((ulong)this >> 8),pkVar8 != pkVar12);
        if (pkVar8 != pkVar12) {
          newSize = pkVar10;
          pkVar7 = pkVar12;
        }
      }
    } while (bVar13 < 10);
    pkVar8 = pkVar7;
    if (((ulong)this & 1) == 0) {
LAB_00404bbc:
      newSize = this;
      bVar2 = false;
      pkVar8 = pkVar9;
    }
    else {
      while( true ) {
        pkVar8 = pkVar8 + 1;
        kVar15 = *pkVar7;
        if ((kVar15 != (kj)0x9) && (kVar15 != (kj)0x20)) break;
        pkVar7 = pkVar7 + 1;
      }
      this = (kj *)(ulong)(byte)kVar15;
      if (kVar15 != (kj)0x2d) goto LAB_00404bbc;
      for (; (*pkVar8 == (kj)0x9 || (pkVar12 = pkVar8, *pkVar8 == (kj)0x20)); pkVar8 = pkVar8 + 1) {
      }
      while( true ) {
        kVar15 = *pkVar12;
        pkVar7 = (kj *)(ulong)(byte)kVar15;
        if ((kVar15 != (kj)0x9) && (kVar15 != (kj)0x20)) break;
        pkVar12 = pkVar12 + 1;
      }
      uVar11 = 0;
      pkVar14 = pkVar12;
      do {
        bVar13 = (char)*pkVar14 - 0x30;
        if (bVar13 < 10) {
          uVar11 = ((uint)(byte)*pkVar14 + uVar11 * 10) - 0x30;
          pkVar14 = pkVar14 + 1;
        }
        else {
          pkVar10 = (kj *)(ulong)(pkVar12 != pkVar14);
          if (pkVar12 != pkVar14) {
            pkVar7 = (kj *)(ulong)uVar11;
            pkVar8 = pkVar14;
          }
        }
      } while (bVar13 < 10);
      while( true ) {
        kVar15 = *pkVar8;
        if ((kVar15 != (kj)0x20) && (kVar15 != (kj)0x9)) break;
        pkVar8 = pkVar8 + 1;
      }
      if (((ulong)pkVar10 & 1) == 0) {
        bVar2 = true;
        pkVar7 = local_70;
      }
      else {
        this = (kj *)(ulong)(byte)kVar15;
        if ((uint)pkVar7 < (uint)newSize) goto LAB_00404bbc;
        if (local_60 <= pkVar7) {
          pkVar7 = (kj *)(ulong)local_64;
        }
        bVar2 = true;
      }
    }
    pkVar12 = pkVar8;
    pkVar9 = pkVar8;
    if (bVar2) {
      bVar2 = true;
      unaff_R12 = newSize;
      unaff_R14 = pkVar7;
    }
    else {
      while( true ) {
        pkVar9 = pkVar9 + 1;
        kVar15 = *pkVar12;
        if ((kVar15 != (kj)0x9) && (kVar15 != (kj)0x20)) break;
        pkVar12 = pkVar12 + 1;
      }
      if (kVar15 == (kj)0x2d) {
        for (; (*pkVar9 == (kj)0x9 || (pkVar7 = pkVar9, *pkVar9 == (kj)0x20)); pkVar9 = pkVar9 + 1)
        {
        }
        for (; (kVar15 = *pkVar7, kVar15 == (kj)0x9 || (kVar15 == (kj)0x20)); pkVar7 = pkVar7 + 1) {
        }
        pkVar10 = (kj *)0x0;
        pkVar12 = pkVar7;
        do {
          bVar13 = (char)*pkVar12 - 0x30;
          if (bVar13 < 10) {
            pkVar10 = (kj *)(ulong)(((uint)(byte)*pkVar12 + (int)pkVar10 * 10) - 0x30);
            pkVar12 = pkVar12 + 1;
          }
          else {
            kVar15 = (kj)(pkVar7 != pkVar12);
            newSize = (kj *)((ulong)newSize & 0xffffffff);
            if ((bool)kVar15) {
              pkVar9 = pkVar12;
              newSize = pkVar10;
            }
          }
        } while (bVar13 < 10);
        if (((byte)kVar15 & 1) == 0) {
          bVar2 = false;
        }
        else {
          for (; (*pkVar9 == (kj)0x20 || (*pkVar9 == (kj)0x9)); pkVar9 = pkVar9 + 1) {
          }
          unaff_R12 = (kj *)0x0;
          if ((kj *)((ulong)newSize & 0xffffffff) <= local_60) {
            unaff_R12 = local_60 + -(long)((ulong)newSize & 0xffffffff);
          }
          bVar2 = true;
          pkVar8 = pkVar9;
          newSize = local_60;
          unaff_R14 = local_70;
        }
      }
      else {
        bVar2 = false;
      }
    }
    bVar3 = bVar1;
    if (bVar2) {
      if (((!bVar1) && (unaff_R12 <= unaff_R14)) &&
         ((unaff_R12 != (kj *)0x0 || (bVar3 = true, unaff_R14 != local_70)))) {
        if (local_98.builder.pos == local_98.builder.endPtr) {
          newSize = (kj *)((long)local_98.builder.endPtr - (long)local_98.builder.ptr >> 3);
          if (local_98.builder.endPtr == local_98.builder.ptr) {
            newSize = (kj *)&DAT_00000004;
          }
          Vector<kj::HttpByteRange>::setCapacity(&local_98,(size_t)newSize);
        }
        (local_98.builder.pos)->start = (uint64_t)unaff_R12;
        (local_98.builder.pos)->end = (uint64_t)unaff_R14;
        local_98.builder.pos = local_98.builder.pos + 1;
        bVar3 = bVar1;
      }
    }
    else {
      __return_storage_ptr__->tag = 3;
    }
    if (!bVar2) goto LAB_00404dd5;
    this = newSize;
    bVar1 = bVar3;
  } while (*pkVar8 == (kj)0x2c);
  if (pkVar8 == local_50 + (long)local_58) {
    if (bVar3) {
      __return_storage_ptr__->tag = 2;
      goto LAB_00404dd5;
    }
    if (local_98.builder.pos != local_98.builder.ptr) {
      Vector<kj::HttpByteRange>::releaseAsArray(&local_48,&local_98);
      __return_storage_ptr__->tag = 1;
      *(HttpByteRange **)&__return_storage_ptr__->field_1 = local_48.ptr;
      *(size_t *)((long)&__return_storage_ptr__->field_1 + 8) = local_48.size_;
      *(ArrayDisposer **)((long)&__return_storage_ptr__->field_1 + 0x10) = local_48.disposer;
      local_48.ptr = (HttpByteRange *)0x0;
      local_48.size_ = 0;
      Array<kj::HttpByteRange>::~Array(&local_48);
      goto LAB_00404dd5;
    }
  }
  __return_storage_ptr__->tag = 3;
LAB_00404dd5:
  pHVar6 = local_98.builder.endPtr;
  pRVar5 = local_98.builder.pos;
  pHVar4 = local_98.builder.ptr;
  if (local_98.builder.ptr != (HttpByteRange *)0x0) {
    local_98.builder.ptr = (HttpByteRange *)0x0;
    local_98.builder.pos = (RemoveConst<kj::HttpByteRange> *)0x0;
    local_98.builder.endPtr = (HttpByteRange *)0x0;
    (**(local_98.builder.disposer)->_vptr_ArrayDisposer)
              (local_98.builder.disposer,pHVar4,0x10,(long)pRVar5 - (long)pHVar4 >> 4,
               (long)pHVar6 - (long)pHVar4 >> 4,0);
  }
  return __return_storage_ptr__;
}

Assistant:

HttpRanges tryParseHttpRangeHeader(kj::ArrayPtr<const char> value, uint64_t contentLength) {
  const char* p = value.begin();
  if (!consumeByteRangeUnit(p)) return HttpUnsatisfiableRange {};
  if (*(p++) != '=') return HttpUnsatisfiableRange {};

  auto fullRange = false;
  kj::Vector<HttpByteRange> satisfiableRanges;
  do {
    KJ_IF_SOME(range, consumeRangeSpec(p, contentLength)) {
      // Don't record more ranges if we've already recorded a full range
      if (!fullRange && range.start <= range.end) {
        if (range.start == 0 && range.end == contentLength - 1) {
          // A range evaluated to the full range, but still need to check rest are valid
          fullRange = true;
        } else {
          // "a valid bytes range-spec is satisfiable if it is either:
          // - an int-range with a first-pos that is less than the current length of the selected
          //   representation or
          // - a suffix-range with a non-zero suffix-length"
          satisfiableRanges.add(range);
        }
      }
    } else {
      // If we failed to parse a range, the whole range specification is invalid
      return HttpUnsatisfiableRange {};
    }
  } while (*(p++) == ',');

  if ((--p) != value.end()) return HttpUnsatisfiableRange {};
  if (fullRange) return HttpEverythingRange {};
  // "A valid ranges-specifier is "satisfiable" if it contains at least one range-spec that is
  // satisfiable"
  if (satisfiableRanges.size() == 0) return HttpUnsatisfiableRange {};
  return satisfiableRanges.releaseAsArray();
}